

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NtkPrintIo(FILE *pFile,Abc_Ntk_t *pNtk,int fPrintFlops)

{
  Abc_Obj_t *pAVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int i;
  uint uVar5;
  
  fprintf((FILE *)pFile,"Primary inputs (%d): ",(ulong)(uint)pNtk->vPis->nSize);
  for (uVar5 = 0; (int)uVar5 < pNtk->vPis->nSize; uVar5 = uVar5 + 1) {
    pAVar1 = Abc_NtkPi(pNtk,uVar5);
    pcVar2 = Abc_ObjName(pAVar1);
    fprintf((FILE *)pFile," %d=%s",(ulong)uVar5,pcVar2);
  }
  fputc(10,(FILE *)pFile);
  fprintf((FILE *)pFile,"Primary outputs (%d):",(ulong)(uint)pNtk->vPos->nSize);
  for (uVar5 = 0; (int)uVar5 < pNtk->vPos->nSize; uVar5 = uVar5 + 1) {
    pAVar1 = Abc_NtkPo(pNtk,uVar5);
    pcVar2 = Abc_ObjName(pAVar1);
    fprintf((FILE *)pFile," %d=%s",(ulong)uVar5,pcVar2);
  }
  fputc(10,(FILE *)pFile);
  if (fPrintFlops != 0) {
    fprintf((FILE *)pFile,"Latches (%d):  ",(ulong)(uint)pNtk->nObjCounts[8]);
    for (i = 0; i < pNtk->vBoxes->nSize; i = i + 1) {
      pAVar1 = Abc_NtkBox(pNtk,i);
      if ((*(uint *)&pAVar1->field_0x14 & 0xf) == 8) {
        pcVar2 = Abc_ObjName(pAVar1);
        pcVar3 = Abc_ObjName((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanouts).pArray]);
        pcVar4 = Abc_ObjName((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray]);
        fprintf((FILE *)pFile," %s(%s=%s)",pcVar2,pcVar3,pcVar4);
      }
    }
    fputc(10,(FILE *)pFile);
    return;
  }
  return;
}

Assistant:

void Abc_NtkPrintIo( FILE * pFile, Abc_Ntk_t * pNtk, int fPrintFlops )
{
    Abc_Obj_t * pObj;
    int i;

    fprintf( pFile, "Primary inputs (%d): ", Abc_NtkPiNum(pNtk) );
    Abc_NtkForEachPi( pNtk, pObj, i )
        fprintf( pFile, " %d=%s", i, Abc_ObjName(pObj) );
//        fprintf( pFile, " %s(%d)", Abc_ObjName(pObj), Abc_ObjFanoutNum(pObj) );
    fprintf( pFile, "\n" );

    fprintf( pFile, "Primary outputs (%d):", Abc_NtkPoNum(pNtk) );
    Abc_NtkForEachPo( pNtk, pObj, i )
        fprintf( pFile, " %d=%s", i, Abc_ObjName(pObj) );
    fprintf( pFile, "\n" );

    if ( !fPrintFlops )
        return;

    fprintf( pFile, "Latches (%d):  ", Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pObj, i )
        fprintf( pFile, " %s(%s=%s)", Abc_ObjName(pObj),
            Abc_ObjName(Abc_ObjFanout0(pObj)), Abc_ObjName(Abc_ObjFanin0(pObj)) );
    fprintf( pFile, "\n" );
}